

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,opj_tcd_t *p_tile_coder,OPJ_BYTE *p_data,
                          OPJ_UINT32 *p_data_written,OPJ_UINT32 total_data_size,
                          opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  OPJ_BYTE *p_data_00;
  OPJ_BYTE *p_PLT_buffer;
  opj_tcd_marker_info_t *poStack_58;
  OPJ_UINT32 l_data_written_PLT;
  opj_tcd_marker_info_t *marker_info;
  opj_codestream_info_t *poStack_48;
  OPJ_UINT32 l_remaining_data;
  opj_codestream_info_t *l_cstr_info;
  opj_stream_private_t *p_stream_local;
  OPJ_UINT32 *pOStack_30;
  OPJ_UINT32 total_data_size_local;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *p_data_local;
  opj_tcd_t *p_tile_coder_local;
  opj_j2k_t *p_j2k_local;
  
  poStack_48 = (opj_codestream_info_t *)0x0;
  poStack_58 = (opj_tcd_marker_info_t *)0x0;
  l_cstr_info = (opj_codestream_info_t *)p_stream;
  p_stream_local._4_4_ = total_data_size;
  pOStack_30 = p_data_written;
  p_data_written_local = (OPJ_UINT32 *)p_data;
  p_data_local = (OPJ_BYTE *)p_tile_coder;
  p_tile_coder_local = (opj_tcd_t *)p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12ba,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bb,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bc,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (total_data_size < 4) {
    opj_event_msg(p_manager,1,"Not enough bytes in output buffer to write SOD marker\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    opj_write_bytes_LE(p_data,0xff93,2);
    marker_info._4_4_ = p_stream_local._4_4_ - 4;
    *(OPJ_UINT32 *)(p_data_local + 4) = p_tile_coder_local->cur_tp_num;
    *(OPJ_UINT32 *)(p_data_local + 8) = p_tile_coder_local->cur_totnum_tp;
    if (p_tile_coder_local->cur_totnum_tp == 0) {
      *(undefined4 *)(**(long **)(p_data_local + 0x18) + 0x350) = 0;
    }
    *pOStack_30 = 0;
    if ((p_tile_coder_local->win_y1 == 0) ||
       (poStack_58 = opj_tcd_marker_info_create(p_tile_coder_local->win_y1),
       poStack_58 != (opj_tcd_marker_info_t *)0x0)) {
      if (marker_info._4_4_ < (uint)p_tile_coder_local->whole_tile_decoding) {
        opj_event_msg(p_manager,1,"Not enough bytes in output buffer to write SOD marker\n");
        opj_tcd_marker_info_destroy(poStack_58);
        p_j2k_local._4_4_ = 0;
      }
      else {
        marker_info._4_4_ = marker_info._4_4_ - p_tile_coder_local->whole_tile_decoding;
        OVar1 = opj_tcd_encode_tile((opj_tcd_t *)p_data_local,
                                    p_tile_coder_local[2].whole_tile_decoding,
                                    (OPJ_BYTE *)((long)p_data_written_local + 2),pOStack_30,
                                    marker_info._4_4_,poStack_48,poStack_58,p_manager);
        if (OVar1 == 0) {
          opj_event_msg(p_manager,1,"Cannot encode tile\n");
          opj_tcd_marker_info_destroy(poStack_58);
          p_j2k_local._4_4_ = 0;
        }
        else {
          *pOStack_30 = *pOStack_30 + 2;
          if (p_tile_coder_local->win_y1 != 0) {
            p_PLT_buffer._4_4_ = 0;
            p_data_00 = (OPJ_BYTE *)opj_malloc((ulong)(uint)p_tile_coder_local->whole_tile_decoding)
            ;
            if (p_data_00 == (OPJ_BYTE *)0x0) {
              opj_event_msg(p_manager,1,"Cannot allocate memory\n");
              opj_tcd_marker_info_destroy(poStack_58);
              return 0;
            }
            OVar1 = opj_j2k_write_plt_in_memory
                              ((opj_j2k_t *)p_tile_coder_local,poStack_58,p_data_00,
                               (OPJ_UINT32 *)((long)&p_PLT_buffer + 4),p_manager);
            if (OVar1 == 0) {
              opj_tcd_marker_info_destroy(poStack_58);
              opj_free(p_data_00);
              return 0;
            }
            if ((uint)p_tile_coder_local->whole_tile_decoding < p_PLT_buffer._4_4_) {
              __assert_fail("l_data_written_PLT <= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                            ,0x132d,
                            "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                           );
            }
            memmove((void *)((long)p_data_written_local + (ulong)p_PLT_buffer._4_4_),
                    p_data_written_local,(ulong)*pOStack_30);
            memcpy(p_data_written_local,p_data_00,(ulong)p_PLT_buffer._4_4_);
            opj_free(p_data_00);
            *pOStack_30 = p_PLT_buffer._4_4_ + *pOStack_30;
          }
          opj_tcd_marker_info_destroy(poStack_58);
          p_j2k_local._4_4_ = 1;
        }
      }
    }
    else {
      opj_event_msg(p_manager,1,"Cannot encode tile: opj_tcd_marker_info_create() failed\n");
      p_j2k_local._4_4_ = 0;
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,
                                  opj_tcd_t * p_tile_coder,
                                  OPJ_BYTE * p_data,
                                  OPJ_UINT32 * p_data_written,
                                  OPJ_UINT32 total_data_size,
                                  const opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_codestream_info_t *l_cstr_info = 00;
    OPJ_UINT32 l_remaining_data;
    opj_tcd_marker_info_t* marker_info = NULL;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);

    if (total_data_size < 4) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, J2K_MS_SOD,
                    2);                                 /* SOD */

    /* make room for the EOF marker */
    l_remaining_data =  total_data_size - 4;

    /* update tile coder */
    p_tile_coder->tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number ;
    p_tile_coder->cur_tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;

    /* INDEX >> */
    /* TODO mergeV2: check this part which use cstr_info */
    /*l_cstr_info = p_j2k->cstr_info;
    if (l_cstr_info) {
            if (!p_j2k->m_specific_param.m_encoder.m_current_tile_part_number ) {
                    //TODO cstr_info->tile[p_j2k->m_current_tile_number].end_header = p_stream_tell(p_stream) + p_j2k->pos_correction - 1;
                    l_cstr_info->tile[p_j2k->m_current_tile_number].tileno = p_j2k->m_current_tile_number;
            }
            else {*/
    /*
    TODO
    if
            (cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno - 1].end_pos < p_stream_tell(p_stream))
    {
            cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno].start_pos = p_stream_tell(p_stream);
    }*/
    /*}*/
    /* UniPG>> */
#ifdef USE_JPWL
    /* update markers struct */
    /*OPJ_BOOL res = j2k_add_marker(p_j2k->cstr_info, J2K_MS_SOD, p_j2k->sod_start, 2);
    */
    assert(0 && "TODO");
#endif /* USE_JPWL */
    /* <<UniPG */
    /*}*/
    /* << INDEX */

    if (p_j2k->m_specific_param.m_encoder.m_current_tile_part_number == 0) {
        p_tile_coder->tcd_image->tiles->packno = 0;
#ifdef deadcode
        if (l_cstr_info) {
            l_cstr_info->packno = 0;
        }
#endif
    }

    *p_data_written = 0;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        marker_info = opj_tcd_marker_info_create(
                          p_j2k->m_specific_param.m_encoder.m_PLT);
        if (marker_info == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Cannot encode tile: opj_tcd_marker_info_create() failed\n");
            return OPJ_FALSE;
        }
    }

    if (l_remaining_data <
            p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }
    l_remaining_data -= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT;

    if (! opj_tcd_encode_tile(p_tile_coder, p_j2k->m_current_tile_number,
                              p_data + 2,
                              p_data_written, l_remaining_data, l_cstr_info,
                              marker_info,
                              p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Cannot encode tile\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }

    /* For SOD */
    *p_data_written += 2;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        OPJ_UINT32 l_data_written_PLT = 0;
        OPJ_BYTE* p_PLT_buffer = (OPJ_BYTE*)opj_malloc(
                                     p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);
        if (!p_PLT_buffer) {
            opj_event_msg(p_manager, EVT_ERROR, "Cannot allocate memory\n");
            opj_tcd_marker_info_destroy(marker_info);
            return OPJ_FALSE;
        }
        if (!opj_j2k_write_plt_in_memory(p_j2k,
                                         marker_info,
                                         p_PLT_buffer,
                                         &l_data_written_PLT,
                                         p_manager)) {
            opj_tcd_marker_info_destroy(marker_info);
            opj_free(p_PLT_buffer);
            return OPJ_FALSE;
        }

        assert(l_data_written_PLT <=
               p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);

        /* Move PLT marker(s) before SOD */
        memmove(p_data + l_data_written_PLT, p_data, *p_data_written);
        memcpy(p_data, p_PLT_buffer, l_data_written_PLT);
        opj_free(p_PLT_buffer);
        *p_data_written += l_data_written_PLT;
    }

    opj_tcd_marker_info_destroy(marker_info);

    return OPJ_TRUE;
}